

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execJmp<(moira::Instr)65,(moira::Mode)10,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  ushort in_SI;
  Moira *in_RDI;
  AEStackFrame frame;
  int delay [12];
  u32 ea;
  int src;
  u32 oldpc;
  int in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined1 local_48 [20];
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_24;
  undefined4 local_20;
  u32 local_18;
  uint local_14;
  u32 local_10;
  
  local_10 = (in_RDI->reg).pc;
  local_14 = in_SI & 7;
  local_18 = computeEA<(moira::Mode)10,(moira::Size)4,2ul>
                       (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_);
  memset(local_48,0,0x30);
  local_34 = 2;
  local_30 = 4;
  local_2c = 2;
  local_24 = 2;
  local_20 = 4;
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,4);
  bVar1 = misaligned<(moira::Size)2>(in_RDI,local_18);
  if (bVar1) {
    frame = makeFrame<0ul>(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_,
                           in_stack_ffffffffffffffa8._0_4_);
    execAddressError(in_RDI,frame,in_stack_ffffffffffffff9c);
  }
  else {
    (in_RDI->reg).pc = local_18;
    fullPrefetch<4ul,0>(in_stack_ffffffffffffffa8._8_8_);
  }
  return;
}

Assistant:

void
Moira::execJmp(u16 opcode)
{
    u32 oldpc = reg.pc;
    
    int src = _____________xxx(opcode);
    u32 ea  = computeEA <M,Long, SKIP_LAST_READ> (src);
    
    const int delay[] = { 0,0,0,0,0,2,4,2,0,2,4,0 };
    sync(delay[M]);
    
    // Check for address error
    if (misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea, oldpc));
        return;
    }
    
    // Jump to new address
    reg.pc = ea;

    // Fill the prefetch queue
    fullPrefetch<POLLIPL>();
}